

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QSizeF *sz)

{
  long lVar1;
  QSizeF *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  double h;
  double w;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_RDI,&in_RSI->wd);
  QDataStream::operator>>(in_RDI,&in_RSI->wd);
  QSizeF::setWidth(in_RSI,-NAN);
  QSizeF::setHeight(in_RSI,-NAN);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QSizeF &sz)
{
    double w, h;
    s >> w;
    s >> h;
    sz.setWidth(qreal(w));
    sz.setHeight(qreal(h));
    return s;
}